

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O2

void __thiscall
glslang::TParseContext::vkRelaxedRemapFunctionParameter
          (TParseContext *this,TFunction *function,TParameter *param,
          vector<int,_std::allocator<int>_> *newParams)

{
  TType *type;
  int iVar1;
  TString *path;
  TFunction **local_50;
  TFunction *local_48;
  TString *local_40;
  TType *pTStack_38;
  TIntermTyped *local_30;
  vector<int,_std::allocator<int>_> *local_28;
  undefined4 extraout_var;
  
  (*(function->super_TSymbol)._vptr_TSymbol[0x16])(function,param);
  iVar1 = (*param->type->_vptr_TType[0x25])();
  if ((char)iVar1 != '\0') {
    iVar1 = (*param->type->_vptr_TType[0x36])();
    if ((char)iVar1 != '\0') {
      path = param->name;
      type = param->type;
      if (path == (TString *)0x0) {
        iVar1 = (*type->_vptr_TType[6])(type);
        path = (TString *)CONCAT44(extraout_var,iVar1);
      }
      local_30 = param->defaultValue;
      local_50 = &local_48;
      local_40 = param->name;
      pTStack_38 = param->type;
      local_48 = function;
      local_28 = newParams;
      ForEachOpaque<glslang::TParseContext::vkRelaxedRemapFunctionParameter(glslang::TFunction*,glslang::TParameter&,std::vector<int,std::allocator<int>>*)::$_0>(glslang::TType_const&,std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>const&,glslang::TParseContext::vkRelaxedRemapFunctionParameter(glslang::TFunction*,glslang::TParameter&,std::vector<int,std::allocator<int>>*)::$_0)
      ::
      {lambda(glslang::TType_const&,std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>const&,bool,auto:1&)#1}
      ::operator()((_lambda_glslang__TType_const__std____cxx11__basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>const__bool_auto_1___1_
                    *)&local_50,type,path,false,(anon_class_8_1_dda845c3 *)&local_50);
    }
  }
  return;
}

Assistant:

void TParseContext::vkRelaxedRemapFunctionParameter(TFunction* function, TParameter& param, std::vector<int>* newParams)
{
    function->addParameter(param);

    if (!param.type->isStruct() || !param.type->containsOpaque())
        return;

    ForEachOpaque(*param.type, (param.name ? *param.name : param.type->getFieldName()),
                  [function, param, newParams](const TType& type, const TString& path) {
                      TString* memberName = NewPoolTString(path.c_str());

                      TType* memberType = new TType();
                      memberType->shallowCopy(type);
                      memberType->getQualifier().storage = param.type->getQualifier().storage;
                      memberType->clearArraySizes();

                      TParameter memberParam = {};
                      memberParam.name = memberName;
                      memberParam.type = memberType;
                      memberParam.defaultValue = nullptr;
                      function->addParameter(memberParam);
                      if (newParams)
                          newParams->push_back(function->getParamCount()-1);
                  });
}